

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O1

void __thiscall
cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile
          (ClassFactoredSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  iterator __position;
  pointer pvVar1;
  _Bit_type *p_Var2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  ostream *poVar7;
  istream *piVar8;
  pointer *ppuVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  _Bit_type _Var16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint word;
  string line;
  ifstream in;
  uint local_2a0;
  int local_29c;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [16];
  string local_278;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_250;
  vector<int,_std::allocator<int>_> *local_248;
  Dict *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_240 = word_dict;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading clusters from ",0x16);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(cluster_file->_M_dataplus)._M_p,
                      cluster_file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ...\n",5);
  std::ifstream::ifstream((istream *)local_238,(string *)cluster_file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                  ,0x61,
                  "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                 );
  }
  local_298 = local_288;
  local_290 = 0;
  local_288[0] = 0;
  local_248 = &this->widx2cidx;
  local_250 = &this->widx2cwidx;
  local_258 = &this->cidx2words;
  local_29c = 0;
LAB_00176c38:
  cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238);
  piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_238,(string *)&local_298,cVar5);
  if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
    iVar20 = 0;
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->singleton_cluster,
               ((long)(this->cidx2words).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->cidx2words).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,false);
    pvVar1 = (this->cidx2words).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)(this->cidx2words).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
    if (lVar10 != 0) {
      uVar12 = (lVar10 >> 3) * -0x5555555555555555;
      p_Var2 = (this->singleton_cluster).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      ppuVar9 = (pointer *)
                ((long)&(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data + 8);
      uVar13 = 0;
      iVar20 = 0;
      do {
        uVar17 = (long)*ppuVar9 - (long)((_Vector_impl_data *)(ppuVar9 + -1))->_M_start;
        iVar20 = iVar20 + (uint)(uVar17 < 5);
        uVar14 = uVar13 >> 6;
        uVar15 = 1L << (uVar13 & 0x3f);
        if (uVar17 < 5) {
          _Var16 = uVar15 | p_Var2[uVar14];
        }
        else {
          _Var16 = ~uVar15 & p_Var2[uVar14];
        }
        p_Var2[uVar14] = _Var16;
        uVar13 = uVar13 + 1;
        ppuVar9 = ppuVar9 + 3;
      } while ((uVar13 & 0xffffffff) <= uVar12 && uVar12 - (uVar13 & 0xffffffff) != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Read ",5);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,local_29c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," words in ",10);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," clusters (",0xb);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," singleton clusters)\n",0x15);
    if (local_298 != local_288) {
      operator_delete(local_298);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  uVar12 = 0xffffffff;
  do {
    uVar11 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar11;
    uVar6 = uVar11;
    if ((uint)local_290 <= uVar11) break;
  } while (local_298[uVar12] == ' ' || local_298[uVar12] == '\t');
  for (; ((uVar6 < (uint)local_290 && (local_298[uVar6] != ' ')) && (local_298[uVar6] != '\t'));
      uVar6 = uVar6 + 1) {
  }
  local_29c = local_29c + 1;
  uVar12 = (ulong)(uVar6 - 1);
  uVar3 = uVar6;
  do {
    uVar3 = uVar3 + 1;
    uVar19 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar19;
    uVar18 = uVar19;
    if ((uint)local_290 <= uVar19) break;
  } while (local_298[uVar12] == ' ' || local_298[uVar12] == '\t');
  do {
    uVar4 = uVar3;
    if ((uint)local_290 <= uVar18) break;
    uVar18 = uVar4 - 1;
    if ((local_298[uVar18] == '\t') || (local_298[uVar18] == ' ')) break;
    uVar3 = uVar4 + 1;
    uVar18 = uVar4;
  } while( true );
  if (uVar6 <= uVar11) {
    __assert_fail("endc > startc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                  ,0x6f,
                  "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                 );
  }
  if (uVar19 <= uVar6) {
    __assert_fail("startw > endc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                  ,0x70,
                  "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                 );
  }
  if (uVar18 <= uVar19) {
    __assert_fail("endw > startw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/cfsm-builder.cc"
                  ,0x71,
                  "void cnn::ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string &, Dict *)"
                 );
  }
  std::__cxx11::string::substr((ulong)&local_278,(ulong)&local_298);
  uVar6 = Dict::Convert(&this->cdict,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_) !=
      &local_278.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_));
  }
  std::__cxx11::string::substr((ulong)&local_278,(ulong)&local_298);
  uVar11 = Dict::Convert(local_240,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_) !=
      &local_278.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_));
  }
  local_2a0 = uVar11;
  if ((ulong)((long)(this->widx2cidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->widx2cidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (ulong)uVar11) {
    local_278._M_dataplus._M_p._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::resize
              (local_248,(ulong)(uVar11 + 1),(value_type_conflict1 *)&local_278);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (local_250,(ulong)(local_2a0 + 1));
  }
  (this->widx2cidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[local_2a0] = uVar6;
  uVar13 = (ulong)uVar6;
  uVar12 = ((long)(this->cidx2words).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->cidx2words).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(local_258,(ulong)(uVar6 + 1));
  }
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            ((this->cidx2words).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar13);
  __position._M_current = *(uint **)(this_00 + 8);
  (this->widx2cwidx).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[local_2a0] =
       (uint)((ulong)((long)__position._M_current - *(long *)this_00) >> 2);
  if (__position._M_current == *(uint **)(this_00 + 0x10)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (this_00,__position,&local_2a0);
  }
  else {
    *__position._M_current = local_2a0;
    *(uint **)(this_00 + 8) = __position._M_current + 1;
  }
  goto LAB_00176c38;
}

Assistant:

void ClassFactoredSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  while(getline(in, line)) {
    ++wc;
    const unsigned len = line.size();
    unsigned startc = 0;
    while (is_ws(line[startc]) && startc < len) { ++startc; }
    unsigned endc = startc;
    while (not_ws(line[endc]) && endc < len) { ++endc; }
    unsigned startw = endc;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endc > startc);
    assert(startw > endc);
    assert(endw > startw);
    unsigned c = cdict.Convert(line.substr(startc, endc - startc));
    unsigned word = word_dict->Convert(line.substr(startw, endw - startw));
    if (word >= widx2cidx.size()) {
      widx2cidx.resize(word + 1, -1);
      widx2cwidx.resize(word + 1);
    }
    widx2cidx[word] = c;
    if (c >= cidx2words.size()) cidx2words.resize(c + 1);
    auto& clusterwords = cidx2words[c];
    widx2cwidx[word] = clusterwords.size();
    clusterwords.push_back(word);
  }
  singleton_cluster.resize(cidx2words.size());
  int scs = 0;
  for (unsigned i = 0; i < cidx2words.size(); ++i) {
    bool sc = cidx2words[i].size() <= 1;
    if (sc) scs++;
    singleton_cluster[i] = sc;
  }
  cerr << "Read " << wc << " words in " << cdict.size() << " clusters (" << scs << " singleton clusters)\n";
}